

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O3

void __thiscall gv_visitor::visit(gv_visitor *this,MoreThanOneExpression *ptr)

{
  pointer ppEVar1;
  Expr *second;
  pointer ppEVar2;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mnogo expr","");
  box(this,ptr,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppEVar1 = (ptr->super_Expressions).exprs.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (ptr->super_Expressions).exprs.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1
      ) {
    second = *ppEVar2;
    arrow(this,ptr,second);
    (**(second->super_Base)._vptr_Base)(second,this);
  }
  return;
}

Assistant:

void gv_visitor::visit(MoreThanOneExpression* ptr) {
    box(ptr, "mnogo expr");
    for(auto i: ptr->exprs) {
        arrow(ptr, i);
        i->accept(this);
    }
}